

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int htmlCheckParagraph(htmlParserCtxtPtr ctxt)

{
  xmlChar *str1;
  uint uVar1;
  int iVar2;
  _xmlSAXHandler *UNRECOVERED_JUMPTABLE;
  long lVar3;
  
  str1 = ctxt->name;
  if (str1 != (xmlChar *)0x0) {
    if (htmlOmittedDefaultValue == 0) goto LAB_0014efcd;
    lVar3 = 0;
    do {
      if (lVar3 == 0x10) goto LAB_0014efcd;
      uVar1 = xmlStrEqual(str1,*(xmlChar **)((long)htmlNoContentElements + lVar3));
      UNRECOVERED_JUMPTABLE = (_xmlSAXHandler *)(ulong)uVar1;
      lVar3 = lVar3 + 8;
    } while (uVar1 == 0);
  }
  htmlAutoClose(ctxt,"p");
  htmlCheckImplied(ctxt,"p");
  htmlnamePush(ctxt,"p");
  UNRECOVERED_JUMPTABLE = ctxt->sax;
  if ((UNRECOVERED_JUMPTABLE != (_xmlSAXHandler *)0x0) &&
     (UNRECOVERED_JUMPTABLE = (_xmlSAXHandler *)UNRECOVERED_JUMPTABLE->startElement,
     UNRECOVERED_JUMPTABLE != (_xmlSAXHandler *)0x0)) {
    iVar2 = (*(code *)UNRECOVERED_JUMPTABLE)(ctxt->userData,"p",0);
    return iVar2;
  }
LAB_0014efcd:
  return (int)UNRECOVERED_JUMPTABLE;
}

Assistant:

static int
htmlCheckParagraph(htmlParserCtxtPtr ctxt) {
    const xmlChar *tag;
    int i;

    if (ctxt == NULL)
	return(-1);
    tag = ctxt->name;
    if (tag == NULL) {
	htmlAutoClose(ctxt, BAD_CAST"p");
	htmlCheckImplied(ctxt, BAD_CAST"p");
	htmlnamePush(ctxt, BAD_CAST"p");
	if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL))
	    ctxt->sax->startElement(ctxt->userData, BAD_CAST"p", NULL);
	return(1);
    }
    if (!htmlOmittedDefaultValue)
	return(0);
    for (i = 0; htmlNoContentElements[i] != NULL; i++) {
	if (xmlStrEqual(tag, BAD_CAST htmlNoContentElements[i])) {
	    htmlAutoClose(ctxt, BAD_CAST"p");
	    htmlCheckImplied(ctxt, BAD_CAST"p");
	    htmlnamePush(ctxt, BAD_CAST"p");
	    if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL))
		ctxt->sax->startElement(ctxt->userData, BAD_CAST"p", NULL);
	    return(1);
	}
    }
    return(0);
}